

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  string *local_38;
  
  bVar2 = false;
  local_38 = replaceThis;
  uVar1 = std::__cxx11::string::find((string *)str,(ulong)replaceThis);
  local_40 = withThis;
  while (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)str);
    std::operator+(&local_80,&local_60,withThis);
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)str);
    std::operator+(&local_c0,&local_80,&local_a0);
    std::__cxx11::string::operator=((string *)str,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    withThis = local_40;
    bVar2 = true;
    uStack_d0 = 0xffffffffffffffff;
    bVar3 = uVar1 < str->_M_string_length - local_40->_M_string_length;
    uVar1 = uStack_d0;
    if (bVar3) {
      uVar1 = std::__cxx11::string::find((string *)str,(ulong)local_38);
    }
  }
  return bVar2;
}

Assistant:

bool replaceInPlace(std::string& str, std::string const& replaceThis, std::string const& withThis) {
		bool replaced = false;
		std::size_t i = str.find(replaceThis);
		while (i != std::string::npos) {
			replaced = true;
			str = str.substr(0, i) + withThis + str.substr(i + replaceThis.size());
			if (i < str.size() - withThis.size())
				i = str.find(replaceThis, i + withThis.size());
			else
				i = std::string::npos;
		}
		return replaced;
	}